

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O3

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
__thiscall
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
scanMul(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        *__return_storage_ptr__,
       FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
       *this,AbstractingUnifier *au,Numeral *k,TermSpec t)

{
  bool bVar1;
  int local_e4;
  RationalConstantType local_e0;
  TermSpec local_c0;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_b0
  ;
  
  local_c0.index = (int)t.term._content;
  local_c0.term._content = (uint64_t)k;
  IntegerConstantType::IntegerConstantType(&local_e0._num,(IntegerConstantType *)au);
  IntegerConstantType::IntegerConstantType(&local_e0._den,(IntegerConstantType *)&au->_constr);
  local_e4 = 0;
  bVar1 = Kernel::operator==(&local_e0,&local_e4);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x90);
    FloorUwaState(__return_storage_ptr__);
  }
  else {
    scan(&local_b0,(AbstractingUnifier *)this,&local_c0);
    mul(__return_storage_ptr__,(AbstractingUnifier *)this,(Numeral *)au,&local_b0);
    Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.shieldedVars);
    Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.intVarSet);
    Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.mixVarSet);
    Lib::
    Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.ratVarSet);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.intAtoms);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.ratAtoms);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.mixVars);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.intVars);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_b0.ratVars);
  }
  mpz_clear(local_e0._den._val);
  mpz_clear((__mpz_struct *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState scanMul(AbstractingUnifier& au, Numeral const& k, TermSpec t) 
  { return k == 0 ? FloorUwaState::zero() : mul(au, k, scan(au, t)); }